

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

string_t __thiscall
duckdb::FSSTVector::AddCompressedString(FSSTVector *this,Vector *vector,string_t data)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  string_t sVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  char *data_00;
  
  data_00 = data.value._0_8_;
  if (0xc < (uint)vector) {
    lVar1 = *(long *)(this + 0x58);
    if (lVar1 == 0) {
      make_buffer<duckdb::VectorFSSTStringBuffer>();
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
      *(undefined8 *)(this + 0x58) = local_38;
      *(undefined8 *)(this + 0x60) = uStack_30;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      lVar1 = *(long *)(this + 0x58);
    }
    sVar2 = StringHeap::AddBlob((StringHeap *)(lVar1 + 0x30),data_00,(ulong)vector & 0xffffffff);
    data_00 = sVar2.value._8_8_;
    vector = sVar2.value._0_8_;
  }
  sVar2.value.pointer.ptr = data_00;
  sVar2.value._0_8_ = vector;
  return (string_t)sVar2.value;
}

Assistant:

string_t FSSTVector::AddCompressedString(Vector &vector, string_t data) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);
	if (data.IsInlined()) {
		// string will be inlined: no need to store in string heap
		return data;
	}
	if (!vector.auxiliary) {
		vector.auxiliary = make_buffer<VectorFSSTStringBuffer>();
	}
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::FSST_BUFFER);
	auto &fsst_string_buffer = vector.auxiliary.get()->Cast<VectorFSSTStringBuffer>();
	return fsst_string_buffer.AddBlob(data);
}